

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

ArchType parseBPFArch(StringRef ArchName)

{
  ArchType AVar1;
  size_t sVar2;
  int *piVar3;
  
  sVar2 = ArchName.Length;
  piVar3 = (int *)ArchName.Data;
  if (sVar2 == 6) {
    if ((short)piVar3[1] == 0x6562 && *piVar3 == 0x5f667062) {
      return bpfeb;
    }
    AVar1 = UnknownArch;
    if ((short)piVar3[1] == 0x656c && *piVar3 == 0x5f667062) {
      return bpfel;
    }
  }
  else if (sVar2 == 5) {
    if ((char)piVar3[1] == 'b' && *piVar3 == 0x65667062) {
      return bpfeb;
    }
    AVar1 = bpfel;
    if ((char)piVar3[1] != 'l' || *piVar3 != 0x65667062) {
      AVar1 = UnknownArch;
    }
  }
  else {
    AVar1 = UnknownArch;
    if ((sVar2 == 3) &&
       (AVar1 = UnknownArch, *(char *)((long)piVar3 + 2) == 'f' && (short)*piVar3 == 0x7062)) {
      return bpfel;
    }
  }
  return AVar1;
}

Assistant:

static Triple::ArchType parseBPFArch(StringRef ArchName) {
  if (ArchName.equals("bpf")) {
    if (sys::IsLittleEndianHost)
      return Triple::bpfel;
    else
      return Triple::bpfeb;
  } else if (ArchName.equals("bpf_be") || ArchName.equals("bpfeb")) {
    return Triple::bpfeb;
  } else if (ArchName.equals("bpf_le") || ArchName.equals("bpfel")) {
    return Triple::bpfel;
  } else {
    return Triple::UnknownArch;
  }
}